

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

XmlWriter * __thiscall Catch::XmlWriter::writeText(XmlWriter *this,string *text,bool indent)

{
  ulong uVar1;
  ostream *poVar2;
  XmlEncode *xmlEncode;
  byte in_DL;
  XmlWriter *in_RDI;
  bool tagWasOpen;
  XmlWriter *in_stack_ffffffffffffffa0;
  XmlEncode *in_stack_ffffffffffffffb0;
  ostream local_40 [46];
  byte local_12;
  byte local_11;
  
  local_11 = in_DL & 1;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    local_12 = in_RDI->m_tagIsOpen & 1;
    ensureTagClosed(in_stack_ffffffffffffffa0);
    if (((local_12 & 1) != 0) && ((local_11 & 1) != 0)) {
      poVar2 = stream(in_RDI);
      std::operator<<(poVar2,(string *)&in_RDI->m_indent);
    }
    xmlEncode = (XmlEncode *)stream(in_RDI);
    poVar2 = local_40;
    XmlEncode::XmlEncode
              (in_stack_ffffffffffffffb0,(string *)in_RDI,(ForWhat)((ulong)poVar2 >> 0x20));
    Catch::operator<<(poVar2,xmlEncode);
    XmlEncode::~XmlEncode((XmlEncode *)0x1bed2b);
    in_RDI->m_needsNewline = true;
  }
  return in_RDI;
}

Assistant:

XmlWriter& writeText( std::string const& text, bool indent = true ) {
            if( !text.empty() ){
                bool tagWasOpen = m_tagIsOpen;
                ensureTagClosed();
                if( tagWasOpen && indent )
                    stream() << m_indent;
                stream() << XmlEncode( text );
                m_needsNewline = true;
            }
            return *this;
        }